

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
MultiBodyInplaceSolverIslandCallback::MultiBodyInplaceSolverIslandCallback
          (MultiBodyInplaceSolverIslandCallback *this,btMultiBodyConstraintSolver *solver,
          btDispatcher *dispatcher)

{
  _func_int **in_RDX;
  _func_int **in_RSI;
  IslandCallback *in_RDI;
  btAlignedObjectArray<btCollisionObject_*> *in_stack_ffffffffffffffc0;
  btAlignedObjectArray<btPersistentManifold_*> *this_00;
  
  btSimulationIslandManager::IslandCallback::IslandCallback(in_RDI);
  in_RDI->_vptr_IslandCallback = (_func_int **)&PTR__MultiBodyInplaceSolverIslandCallback_002e7fe8;
  in_RDI[1]._vptr_IslandCallback = (_func_int **)0x0;
  in_RDI[2]._vptr_IslandCallback = in_RSI;
  in_RDI[3]._vptr_IslandCallback = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[6]._vptr_IslandCallback = 0;
  in_RDI[7]._vptr_IslandCallback = (_func_int **)0x0;
  in_RDI[8]._vptr_IslandCallback = in_RDX;
  btAlignedObjectArray<btCollisionObject_*>::btAlignedObjectArray(in_stack_ffffffffffffffc0);
  this_00 = (btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 0xd);
  btAlignedObjectArray<btPersistentManifold_*>::btAlignedObjectArray(this_00);
  btAlignedObjectArray<btTypedConstraint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btTypedConstraint_*> *)this_00);
  btAlignedObjectArray<btMultiBodyConstraint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)this_00);
  return;
}

Assistant:

MultiBodyInplaceSolverIslandCallback(	btMultiBodyConstraintSolver*	solver,
									btDispatcher* dispatcher)
		:m_solverInfo(NULL),
		m_solver(solver),
		m_multiBodySortedConstraints(NULL),
		m_numConstraints(0),
		m_debugDrawer(NULL),
		m_dispatcher(dispatcher)
	{

	}